

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O1

void TranslateDoWhile(ExpressionTranslateContext *ctx,ExprDoWhile *expression)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint *puVar4;
  
  uVar1 = ctx->nextLoopBreakId;
  uVar2 = ctx->nextLoopContinueId;
  ctx->nextLoopBreakId = uVar1 + 1;
  ctx->nextLoopContinueId = uVar2 + 1;
  uVar3 = (ctx->loopBreakIdStack).count;
  if (uVar3 == (ctx->loopBreakIdStack).max) {
    SmallArray<unsigned_int,_32U>::grow(&ctx->loopBreakIdStack,uVar3);
  }
  puVar4 = (ctx->loopBreakIdStack).data;
  if (puVar4 != (uint *)0x0) {
    uVar3 = (ctx->loopBreakIdStack).count;
    (ctx->loopBreakIdStack).count = uVar3 + 1;
    puVar4[uVar3] = uVar1;
    uVar3 = (ctx->loopContinueIdStack).count;
    if (uVar3 == (ctx->loopContinueIdStack).max) {
      SmallArray<unsigned_int,_32U>::grow(&ctx->loopContinueIdStack,uVar3);
    }
    puVar4 = (ctx->loopContinueIdStack).data;
    if (puVar4 != (uint *)0x0) {
      uVar3 = (ctx->loopContinueIdStack).count;
      (ctx->loopContinueIdStack).count = uVar3 + 1;
      puVar4[uVar3] = uVar2;
      Print(ctx,"do");
      OutputContext::Print(ctx->output,"\n",1);
      PrintIndentedLine(ctx,"{");
      ctx->depth = ctx->depth + 1;
      PrintIndent(ctx);
      Translate(ctx,expression->body);
      Print(ctx,";");
      OutputContext::Print(ctx->output,"\n",1);
      Print(ctx,"continue_%d:;",(ulong)uVar2);
      OutputContext::Print(ctx->output,"\n",1);
      ctx->depth = ctx->depth - 1;
      PrintIndentedLine(ctx,"}");
      PrintIndent(ctx);
      Print(ctx,"while(");
      Translate(ctx,expression->condition);
      Print(ctx,");");
      OutputContext::Print(ctx->output,"\n",1);
      Print(ctx,"break_%d:",(ulong)uVar1);
      OutputContext::Print(ctx->output,"\n",1);
      PrintIndent(ctx);
      uVar1 = (ctx->loopBreakIdStack).count;
      if (uVar1 != 0) {
        (ctx->loopBreakIdStack).count = uVar1 - 1;
        uVar1 = (ctx->loopContinueIdStack).count;
        if (uVar1 != 0) {
          (ctx->loopContinueIdStack).count = uVar1 - 1;
          return;
        }
      }
      __assert_fail("count > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                    ,0x183,
                    "void SmallArray<unsigned int, 32>::pop_back() [T = unsigned int, N = 32]");
    }
  }
  __assert_fail("data",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x162,
                "void SmallArray<unsigned int, 32>::push_back(const T &) [T = unsigned int, N = 32]"
               );
}

Assistant:

void TranslateDoWhile(ExpressionTranslateContext &ctx, ExprDoWhile *expression)
{
	unsigned loopBreakId = ctx.nextLoopBreakId++;
	unsigned loopContinueId = ctx.nextLoopContinueId++;
	ctx.loopBreakIdStack.push_back(loopBreakId);
	ctx.loopContinueIdStack.push_back(loopContinueId);

	Print(ctx, "do");
	PrintLine(ctx);

	PrintIndentedLine(ctx, "{");
	ctx.depth++;
	PrintIndent(ctx);

	Translate(ctx, expression->body);

	Print(ctx, ";");
	PrintLine(ctx);

	Print(ctx, "continue_%d:;", loopContinueId);
	PrintLine(ctx);

	ctx.depth--;
	PrintIndentedLine(ctx, "}");

	PrintIndent(ctx);
	Print(ctx, "while(");
	Translate(ctx, expression->condition);
	Print(ctx, ");");
	PrintLine(ctx);

	Print(ctx, "break_%d:", loopBreakId);
	PrintLine(ctx);
	PrintIndent(ctx);

	ctx.loopBreakIdStack.pop_back();
	ctx.loopContinueIdStack.pop_back();
}